

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_aggsig_partial_sign
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,
              secp256k1_aggsig_partial_signature *partial,uchar *msghash32,uchar *seckey32,
              size_t index)

{
  int iVar1;
  ulong uVar2;
  int overflow;
  secp256k1_scalar sighash;
  secp256k1_ge tmp_ge;
  uchar prehash [32];
  int local_f4;
  secp256k1_scalar local_f0;
  secp256k1_scalar local_d0;
  secp256k1_ge local_b0;
  uchar local_58 [40];
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_aggsig_partial_sign_cold_2();
  }
  else {
    if (index < aggctx->n_sigs) {
      uVar2 = 0;
      do {
        if (aggctx->progress[uVar2] == NONCE_PROGRESS_UNKNOWN) {
          return 0;
        }
        uVar2 = uVar2 + 1;
      } while (aggctx->n_sigs != uVar2);
      if (aggctx->progress[index] != NONCE_PROGRESS_OURS) {
        return 0;
      }
      secp256k1_ge_set_gej(&local_b0,&aggctx->pubnonce_sum);
      iVar1 = secp256k1_gej_has_quad_y_var(&aggctx->pubnonce_sum);
      if (iVar1 == 0) {
        secp256k1_scalar_negate(aggctx->secnonce + index,aggctx->secnonce + index);
        secp256k1_ge_neg(&local_b0,&local_b0);
      }
      secp256k1_fe_normalize(&local_b0.x);
      secp256k1_compute_prehash(ctx,local_58,aggctx->pubkeys,aggctx->n_sigs,&local_b0.x,msghash32);
      iVar1 = secp256k1_compute_sighash(&local_d0,local_58,index);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_f0,seckey32,&local_f4);
      if (local_f4 != 0) {
        return 0;
      }
      secp256k1_scalar_mul(&local_f0,&local_f0,&local_d0);
      secp256k1_scalar_add(&local_f0,&local_f0,aggctx->secnonce + index);
      secp256k1_scalar_get_b32(partial->data,&local_f0);
      aggctx->progress[index] = NONCE_PROGRESS_SIGNED;
      return 1;
    }
    secp256k1_aggsig_partial_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_aggsig_partial_sign(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, secp256k1_aggsig_partial_signature *partial, const unsigned char *msghash32, const unsigned char *seckey32, size_t index) {
    size_t i;
    secp256k1_scalar sighash;
    secp256k1_scalar sec;
    secp256k1_ge tmp_ge;
    int overflow;
    unsigned char prehash[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(partial != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(index < aggctx->n_sigs);

    /* check state machine */
    for (i = 0; i < aggctx->n_sigs; i++) {
        if (aggctx->progress[i] == NONCE_PROGRESS_UNKNOWN) {
            return 0;
        }
    }
    if (aggctx->progress[index] != NONCE_PROGRESS_OURS) {
        return 0;
    }

    /* sign */
    /* If the total public nonce has wrong sign, negate our
     * secret nonce. Everyone will negate the public one
     * at combine time. */
    secp256k1_ge_set_gej(&tmp_ge, &aggctx->pubnonce_sum);  /* TODO cache this */
    if (!secp256k1_gej_has_quad_y_var(&aggctx->pubnonce_sum)) {
        secp256k1_scalar_negate(&aggctx->secnonce[index], &aggctx->secnonce[index]);
        secp256k1_ge_neg(&tmp_ge, &tmp_ge);
    }
    secp256k1_fe_normalize(&tmp_ge.x);
    secp256k1_compute_prehash(ctx, prehash, aggctx->pubkeys, aggctx->n_sigs, &tmp_ge.x, msghash32);
    if (secp256k1_compute_sighash(&sighash, prehash, index) == 0) {
        return 0;
    }
    secp256k1_scalar_set_b32(&sec, seckey32, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&sec);
        return 0;
    }
    secp256k1_scalar_mul(&sec, &sec, &sighash);
    secp256k1_scalar_add(&sec, &sec, &aggctx->secnonce[index]);

    /* finalize */
    secp256k1_scalar_get_b32(partial->data, &sec);
    secp256k1_scalar_clear(&sec);
    aggctx->progress[index] = NONCE_PROGRESS_SIGNED;
    return 1;
}